

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O2

sstring_view<std::shared_ptr<const_char>_> * __thiscall
pstore::make_shared_sstring_view<char_const>
          (sstring_view<std::shared_ptr<const_char>_> *__return_storage_ptr__,pstore *this,
          shared_ptr<const_char> *ptr,size_t length)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,(__shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2> *)this);
  _Var1._M_pi = local_28._M_refcount._M_pi;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28._M_ptr;
  (__return_storage_ptr__->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  local_28._M_ptr = (element_type *)0x0;
  __return_storage_ptr__->size_ = (size_type)ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

inline sstring_view<std::shared_ptr<ValueType>>
    make_shared_sstring_view (std::shared_ptr<ValueType> const & ptr, std::size_t length) {
        return {ptr, length};
    }